

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError file2string(char **bufp,FILE *file)

{
  int iVar1;
  CURLcode CVar2;
  size_t len;
  size_t sVar3;
  char *pcVar4;
  size_t nlen;
  size_t nread;
  char *ptr;
  char buffer [4096];
  undefined1 local_40 [8];
  dynbuf dyn;
  FILE *file_local;
  char **bufp_local;
  
  dyn.toobig = (size_t)file;
  curlx_dyn_init((dynbuf *)local_40,0x400000000);
  if (dyn.toobig != 0) {
    do {
      nlen = fread(&ptr,1,0x1000,(FILE *)dyn.toobig);
      iVar1 = ferror((FILE *)dyn.toobig);
      if (iVar1 != 0) {
        curlx_dyn_free((dynbuf *)local_40);
        *bufp = (char *)0x0;
        return PARAM_READ_ERROR;
      }
      nread = (size_t)&ptr;
      while (nlen != 0) {
        len = memcrlf((char *)nread,false,nlen);
        CVar2 = curlx_dyn_addn((dynbuf *)local_40,(void *)nread,len);
        if (CVar2 != CURLE_OK) {
          return PARAM_NO_MEM;
        }
        nlen = nlen - len;
        if (nlen != 0) {
          sVar3 = memcrlf((char *)(len + nread),true,nlen);
          nread = (size_t)((char *)(len + nread) + sVar3);
          nlen = nlen - sVar3;
        }
      }
      iVar1 = feof((FILE *)dyn.toobig);
    } while (iVar1 == 0);
  }
  pcVar4 = curlx_dyn_ptr((dynbuf *)local_40);
  *bufp = pcVar4;
  return PARAM_OK;
}

Assistant:

ParameterError file2string(char **bufp, FILE *file)
{
  struct curlx_dynbuf dyn;
  curlx_dyn_init(&dyn, MAX_FILE2STRING);
  if(file) {
    do {
      char buffer[4096];
      char *ptr;
      size_t nread = fread(buffer, 1, sizeof(buffer), file);
      if(ferror(file)) {
        curlx_dyn_free(&dyn);
        *bufp = NULL;
        return PARAM_READ_ERROR;
      }
      ptr = buffer;
      while(nread) {
        size_t nlen = memcrlf(ptr, FALSE, nread);
        if(curlx_dyn_addn(&dyn, ptr, nlen))
          return PARAM_NO_MEM;
        nread -= nlen;

        if(nread) {
          ptr += nlen;
          nlen = memcrlf(ptr, TRUE, nread);
          ptr += nlen;
          nread -= nlen;
        }
      }
    } while(!feof(file));
  }
  *bufp = curlx_dyn_ptr(&dyn);
  return PARAM_OK;
}